

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  Reflection *this;
  ulong uVar6;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if ((field[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_28,&local_30);
    }
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) &&
       (*(int *)(field + 0x3c) != 3)) {
      sVar5 = MessageSetItemByteSize(field,message);
      return sVar5;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar4 = Reflection::FieldSize(this,message,field);
    uVar6 = (ulong)uVar4;
  }
  else {
    uVar6 = 1;
    if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
      bVar3 = Reflection::HasField(this,message,field);
      uVar6 = (ulong)bVar3;
    }
  }
  sVar5 = FieldDataOnlyByteSize(field,message);
  bVar3 = FieldDescriptor::is_packed(field);
  if (bVar3) {
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      uVar4 = *(int *)(field + 0x44) * 8 + 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = (iVar2 * 9 + 0x49U >> 6) + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
  }
  else {
    iVar1 = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_28,&local_30);
    }
    uVar4 = iVar1 * 8 + 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = ((ulong)(iVar1 * 9 + 0x49U >> 6) << (*(int *)(field + 0x38) == 10)) * uVar6 + sVar5;
  }
  return sVar5;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count = FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}